

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
single_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
             *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause)

{
  timer_manager_t *ptVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_sync_objects);
  if (iVar2 == 0) {
    ptVar1 = (this->m_timer_manager)._M_t.
             super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
             .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl;
    (*ptVar1->_vptr_timer_manager_t[5])(ptVar1,type_wrapper,mbox,msg,pause.__r,0);
    if ((this->m_sync_objects).m_status == waiting) {
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_sync_objects);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::single_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		m_timer_manager->schedule_anonymous(
				type_wrapper,
				mbox,
				msg,
				pause,
				std::chrono::milliseconds::zero() );

		wakeup_if_waiting( m_sync_objects );
	}